

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,duckdb::hugeint_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  long lVar9;
  const_reference pvVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  hugeint_t *lhs_data;
  idx_t iVar15;
  bool bVar16;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar10 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar10;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar14 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      iVar11 = 0;
      iVar15 = 0;
      do {
        iVar12 = iVar15;
        if (psVar6 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar6[iVar15];
        }
        iVar13 = iVar12;
        if (psVar7 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar7[iVar12];
        }
        lVar8 = *(long *)(pdVar4 + iVar12 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) {
LAB_012b3fcd:
          *no_match_count = iVar14 + 1;
          no_match_sel->sel_vector[iVar14] = (sel_t)iVar12;
          iVar14 = iVar14 + 1;
        }
        else {
          lVar9 = *(long *)(lVar8 + 8 + vVar5);
          if ((lVar9 <= *(long *)(pdVar3 + iVar13 * 0x10 + 8)) &&
             (*(ulong *)(lVar8 + vVar5) <= *(ulong *)(pdVar3 + iVar13 * 0x10) ||
              lVar9 != *(long *)(pdVar3 + iVar13 * 0x10 + 8))) goto LAB_012b3fcd;
          psVar6[iVar11] = (sel_t)iVar12;
          iVar11 = iVar11 + 1;
        }
        iVar15 = iVar15 + 1;
        if (count == iVar15) {
          return iVar11;
        }
      } while( true );
    }
  }
  else if (count != 0) {
    iVar14 = *no_match_count;
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    iVar11 = 0;
    iVar15 = 0;
    do {
      iVar12 = iVar15;
      if (psVar6 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar6[iVar15];
      }
      iVar13 = iVar12;
      if (psVar7 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar7[iVar12];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar16 = false;
      }
      else {
        bVar16 = (puVar1[iVar13 >> 6] >> (iVar13 & 0x3f) & 1) == 0;
      }
      if ((bVar16) ||
         (lVar8 = *(long *)(pdVar4 + iVar12 * 8),
         ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_012b3f06:
        *no_match_count = iVar14 + 1;
        no_match_sel->sel_vector[iVar14] = (sel_t)iVar12;
        iVar14 = iVar14 + 1;
      }
      else {
        lVar9 = *(long *)(lVar8 + 8 + vVar5);
        if ((lVar9 <= *(long *)(pdVar3 + iVar13 * 0x10 + 8)) &&
           (*(ulong *)(lVar8 + vVar5) <= *(ulong *)(pdVar3 + iVar13 * 0x10) ||
            lVar9 != *(long *)(pdVar3 + iVar13 * 0x10 + 8))) goto LAB_012b3f06;
        psVar6[iVar11] = (sel_t)iVar12;
        iVar11 = iVar11 + 1;
      }
      iVar15 = iVar15 + 1;
      if (count == iVar15) {
        return iVar11;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}